

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O2

Message * xs::readMessage(Socket *socket)

{
  InfoMessage *this;
  undefined **ppuVar1;
  Error *this_00;
  MessageType type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> messageBuf;
  size_t messageSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header;
  
  header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  readBytes(socket,&header,8);
  Message::parseHeader
            (header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)((int)header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),&type,&messageSize);
  if (type == MESSAGETYPE_KEEPALIVE) {
    this = (InfoMessage *)operator_new(0x10);
    (this->super_Message).type = MESSAGETYPE_KEEPALIVE;
    ppuVar1 = &PTR__Message_0010eb00;
  }
  else {
    if (type != MESSAGETYPE_PROCESS_STARTED) {
      messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      readBytes(socket,&messageBuf,messageSize - 8);
      switch(type) {
      case MESSAGETYPE_PROCESS_LAUNCH_FAILED:
        this = (InfoMessage *)operator_new(0x30);
        ProcessLaunchFailedMessage::ProcessLaunchFailedMessage
                  ((ProcessLaunchFailedMessage *)this,
                   messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)((int)messageBuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)messageBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
        break;
      case MESSAGETYPE_PROCESS_FINISHED:
        this = (InfoMessage *)operator_new(0x10);
        ProcessFinishedMessage::ProcessFinishedMessage
                  ((ProcessFinishedMessage *)this,
                   messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)((int)messageBuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)messageBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
        break;
      case MESSAGETYPE_PROCESS_LOG_DATA:
        this = (InfoMessage *)operator_new(0x30);
        ProcessLogDataMessage::ProcessLogDataMessage
                  ((ProcessLogDataMessage *)this,
                   messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)((int)messageBuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)messageBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
        break;
      case MESSAGETYPE_INFO:
        this = (InfoMessage *)operator_new(0x30);
        InfoMessage::InfoMessage
                  (this,messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                   (long)((int)messageBuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)messageBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
        break;
      default:
        if (type == MESSAGETYPE_HELLO) {
          this = (InfoMessage *)operator_new(0x10);
          HelloMessage::HelloMessage
                    ((HelloMessage *)this,
                     messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)((int)messageBuf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (int)messageBuf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start));
        }
        else {
          if (type != MESSAGETYPE_TEST) {
            this_00 = (Error *)__cxa_allocate_exception(0x10);
            Error::Error(this_00,"Unknown message","",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/tools/xsClient.cpp"
                         ,0x84);
            __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
          }
          this = (InfoMessage *)operator_new(0x30);
          TestMessage::TestMessage
                    ((TestMessage *)this,
                     messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)((int)messageBuf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (int)messageBuf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start));
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_0010690f;
    }
    this = (InfoMessage *)operator_new(0x10);
    (this->super_Message).type = MESSAGETYPE_PROCESS_STARTED;
    ppuVar1 = &PTR__Message_0010eb40;
  }
  (this->super_Message)._vptr_Message = (_func_int **)ppuVar1;
LAB_0010690f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return &this->super_Message;
}

Assistant:

Message* readMessage (de::Socket& socket)
{
	// Header.
	vector<deUint8> header;
	readBytes(socket, header, MESSAGE_HEADER_SIZE);

	MessageType	type;
	size_t		messageSize;
	Message::parseHeader(&header[0], (int)header.size(), type, messageSize);

	// Simple messages without any data.
	switch (type)
	{
		case MESSAGETYPE_KEEPALIVE:				return new KeepAliveMessage();
		case MESSAGETYPE_PROCESS_STARTED:		return new ProcessStartedMessage();
		default:
			break; // Read message with data.
	}

	vector<deUint8> messageBuf;
	readBytes(socket, messageBuf, messageSize-MESSAGE_HEADER_SIZE);

	switch (type)
	{
		case MESSAGETYPE_HELLO:					return new HelloMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_TEST:					return new TestMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_LOG_DATA:		return new ProcessLogDataMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_INFO:					return new InfoMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_LAUNCH_FAILED:	return new ProcessLaunchFailedMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_FINISHED:		return new ProcessFinishedMessage(&messageBuf[0], (int)messageBuf.size());
		default:
			XS_FAIL("Unknown message");
	}
}